

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListIteratorTest_cbegin_cend_forward_Test::
~IntrusiveListIteratorTest_cbegin_cend_forward_Test
          (IntrusiveListIteratorTest_cbegin_cend_forward_Test *this)

{
  anon_unknown.dwarf_6462d::IntrusiveListIteratorTest::~IntrusiveListIteratorTest
            (&this->super_IntrusiveListIteratorTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, cbegin_cend_forward) {
  TestForward(list_.cbegin(), list_.cend(), {1, 2, 3});
  TestForward(clist_.cbegin(), clist_.cend(), {1, 2, 3});
}